

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCRgba.cpp
# Opt level: O2

void anon_unknown.dwarf_2684e2::convertImfRgbaToRgbaPixels
               (Array2D<ImfRgba> *ImfRgbaPixels,Array2D<Imf_3_4::Rgba> *RgbaPixels,int w,int h)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  
  uVar4 = 0;
  uVar5 = (ulong)(uint)w;
  if (w < 1) {
    uVar5 = uVar4;
  }
  uVar1 = (ulong)(uint)h;
  if (h < 1) {
    uVar1 = uVar4;
  }
  for (uVar3 = 0; uVar3 != uVar1; uVar3 = uVar3 + 1) {
    for (lVar2 = 0; uVar5 * 8 != lVar2; lVar2 = lVar2 + 8) {
      fVar6 = (float)ImfHalfToFloat(*(undefined2 *)
                                     ((long)&ImfRgbaPixels->_data->r +
                                     lVar2 + ImfRgbaPixels->_sizeY * uVar4));
      Imath_3_2::half::operator=
                ((half *)((long)&(RgbaPixels->_data->r)._h + lVar2 + RgbaPixels->_sizeY * uVar4),
                 fVar6);
      fVar6 = (float)ImfHalfToFloat(*(undefined2 *)
                                     ((long)&ImfRgbaPixels->_data->g +
                                     lVar2 + ImfRgbaPixels->_sizeY * uVar4));
      Imath_3_2::half::operator=
                ((half *)((long)&(RgbaPixels->_data->g)._h + lVar2 + RgbaPixels->_sizeY * uVar4),
                 fVar6);
      fVar6 = (float)ImfHalfToFloat(*(undefined2 *)
                                     ((long)&ImfRgbaPixels->_data->b +
                                     lVar2 + ImfRgbaPixels->_sizeY * uVar4));
      Imath_3_2::half::operator=
                ((half *)((long)&(RgbaPixels->_data->b)._h + lVar2 + RgbaPixels->_sizeY * uVar4),
                 fVar6);
      fVar6 = (float)ImfHalfToFloat(*(undefined2 *)
                                     ((long)&ImfRgbaPixels->_data->a +
                                     lVar2 + ImfRgbaPixels->_sizeY * uVar4));
      Imath_3_2::half::operator=
                ((half *)((long)&(RgbaPixels->_data->a)._h + lVar2 + RgbaPixels->_sizeY * uVar4),
                 fVar6);
    }
    uVar4 = uVar4 + 8;
  }
  return;
}

Assistant:

void 
convertImfRgbaToRgbaPixels (const Array2D<ImfRgba>& ImfRgbaPixels,
                            Array2D<Rgba>& RgbaPixels, 
                            int w, 
                            int h)
{
    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            RgbaPixels[y][x].r = ImfHalfToFloat (ImfRgbaPixels[y][x].r);
            RgbaPixels[y][x].g = ImfHalfToFloat (ImfRgbaPixels[y][x].g);
            RgbaPixels[y][x].b = ImfHalfToFloat (ImfRgbaPixels[y][x].b);
            RgbaPixels[y][x].a = ImfHalfToFloat (ImfRgbaPixels[y][x].a);
        }
    }
}